

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subset_iterator.hpp
# Opt level: O2

subset_iterator<const_char_*,_std::less<void>,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
* __thiscall
burst::make_subset_iterator<std::initializer_list<char>const&>
          (subset_iterator<const_char_*,_std::less<void>,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
           *__return_storage_ptr__,burst *this,initializer_list<char> *range)

{
  subset_iterator<const_char_*,_std::less<void>,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
  ::subset_iterator(__return_storage_ptr__,*(long *)this,*(long *)(this + 8) + *(long *)this);
  return __return_storage_ptr__;
}

Assistant:

auto make_subset_iterator (ForwardRange && range)
    {
        using std::begin;
        using std::end;
        return
            make_subset_iterator
            (
                begin(std::forward<ForwardRange>(range)),
                end(std::forward<ForwardRange>(range))
            );
    }